

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last_modification_time.h
# Opt level: O1

double last_modification_time(string *path)

{
  int iVar1;
  stat s;
  stat local_90;
  
  iVar1 = stat((path->_M_dataplus)._M_p,&local_90);
  if (-1 < iVar1) {
    return (double)local_90.st_mtim.tv_nsec * 1e-09 + (double)local_90.st_mtim.tv_sec;
  }
  return -1.0;
}

Assistant:

double last_modification_time(const std::string & path)
{
  struct stat s;
  struct timespec t = {0,0};
  if (stat(path.c_str(), &s) < 0) { return -1; }
#ifdef __APPLE__
  t = s.st_mtimespec;
#else // Linux?
  t = s.st_mtim;
#endif
  return double(t.tv_sec) + double(t.tv_nsec)*1e-9;
}